

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertForCygwin.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ConvertForCygwin::convertProgramForCygwin
          (string *__return_storage_ptr__,ConvertForCygwin *this,string *filePath)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,"$(cygpath \'",filePath);
  ::std::operator+(__return_storage_ptr__,&local_30,"\')");
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertForCygwin::convertProgramForCygwin(const std::string& filePath)
    {
        return "$(cygpath '" + filePath + "')";
    }